

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

bool deqp::egl::SurfaceConfig::compareColorBufferBits
               (SurfaceConfig *a,SurfaceConfig *b,BVec4 *specifiedRGBColors,
               BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  bool local_a9;
  Vector<int,_2> local_4c;
  IVec2 mask_1;
  IVec4 mask;
  bool yuvPlaneBppSpecified_local;
  BVec2 *specifiedLuminanceColors_local;
  BVec4 *specifiedRGBColors_local;
  SurfaceConfig *b_local;
  SurfaceConfig *a_local;
  
  dVar1 = (a->m_info).colorBufferType;
  if (dVar1 == 0x308e) {
    tcu::Vector<bool,_4>::cast<int>((Vector<bool,_4> *)&mask_1);
    iVar10 = (a->m_info).redSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,0);
    iVar11 = *piVar17;
    iVar12 = (a->m_info).greenSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,1);
    iVar13 = *piVar17;
    iVar14 = (a->m_info).blueSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,2);
    iVar15 = *piVar17;
    iVar16 = (a->m_info).alphaSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,3);
    iVar2 = *piVar17;
    iVar3 = (b->m_info).redSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,0);
    iVar4 = *piVar17;
    iVar5 = (b->m_info).greenSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,1);
    iVar6 = *piVar17;
    iVar7 = (b->m_info).blueSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,2);
    iVar8 = *piVar17;
    iVar9 = (b->m_info).alphaSize;
    piVar17 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)&mask_1,3);
    a_local._7_1_ =
         iVar3 * iVar4 + iVar5 * iVar6 + iVar7 * iVar8 + iVar9 * *piVar17 <
         iVar10 * iVar11 + iVar12 * iVar13 + iVar14 * iVar15 + iVar16 * iVar2;
  }
  else if (dVar1 == 0x308f) {
    tcu::Vector<bool,_2>::cast<int>((Vector<bool,_2> *)&local_4c);
    iVar10 = (a->m_info).luminanceSize;
    piVar17 = tcu::Vector<int,_2>::operator[](&local_4c,0);
    iVar11 = *piVar17;
    iVar12 = (a->m_info).alphaSize;
    piVar17 = tcu::Vector<int,_2>::operator[](&local_4c,1);
    iVar13 = *piVar17;
    iVar14 = (b->m_info).luminanceSize;
    piVar17 = tcu::Vector<int,_2>::operator[](&local_4c,0);
    iVar15 = *piVar17;
    iVar16 = (b->m_info).alphaSize;
    piVar17 = tcu::Vector<int,_2>::operator[](&local_4c,1);
    a_local._7_1_ = iVar14 * iVar15 + iVar16 * *piVar17 < iVar10 * iVar11 + iVar12 * iVar13;
  }
  else if (dVar1 == 0x3300) {
    if (yuvPlaneBppSpecified) {
      local_a9 = (b->m_info).yuvPlaneBpp < (a->m_info).yuvPlaneBpp;
    }
    else {
      local_a9 = false;
    }
    a_local._7_1_ = local_a9;
  }
  else {
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

static bool compareColorBufferBits (const SurfaceConfig& a, const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified)
	{
		DE_ASSERT(a.m_info.colorBufferType == b.m_info.colorBufferType);
		switch (a.m_info.colorBufferType)
		{
			case EGL_RGB_BUFFER:
			{
				const tcu::IVec4	mask	(specifiedRGBColors.cast<deInt32>());

				return (a.m_info.redSize * mask[0] + a.m_info.greenSize * mask[1] + a.m_info.blueSize * mask[2] + a.m_info.alphaSize * mask[3])
						> (b.m_info.redSize * mask[0] + b.m_info.greenSize * mask[1] + b.m_info.blueSize * mask[2] + b.m_info.alphaSize * mask[3]);
			}

			case EGL_LUMINANCE_BUFFER:
			{
				const tcu::IVec2	mask	(specifiedLuminanceColors.cast<deInt32>());

				return (a.m_info.luminanceSize * mask[0] + a.m_info.alphaSize * mask[1]) > (b.m_info.luminanceSize * mask[0] + b.m_info.alphaSize * mask[1]);
			}

			case EGL_YUV_BUFFER_EXT:
				return yuvPlaneBppSpecified ? (a.m_info.yuvPlaneBpp > b.m_info.yuvPlaneBpp) : false;

			default:
				DE_ASSERT(DE_FALSE);
				return true;
		}
	}